

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependInt16
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,int16 value,
          BufferBuilderInt16 **entryOut)

{
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a458;
  *(int16 *)&value_00->field_0x14 = value;
  pIVar1 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar1;
  if (entryOut != (BufferBuilderInt16 **)0x0) {
    *entryOut = (BufferBuilderInt16 *)value_00;
  }
  return 2;
}

Assistant:

uint32 PrependInt16(BufferBuilderList & builder, LPCWSTR clue, int16 value, BufferBuilderInt16 ** entryOut = nullptr)
    {
        auto entry = Anew(alloc, BufferBuilderInt16, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        if (entryOut)
        {
            *entryOut = entry;
        }
        return sizeof(int16);
    }